

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_matcher.cpp
# Opt level: O1

idx_t duckdb::TemplatedMatch<false,double,duckdb::LessThan>
                (Vector *param_1,TupleDataVectorFormat *lhs_format,SelectionVector *sel,idx_t count,
                TupleDataLayout *rhs_layout,Vector *rhs_row_locations,idx_t col_idx,
                vector<duckdb::MatchFunction,_true> *param_8,SelectionVector *no_match_sel,
                idx_t *no_match_count)

{
  unsigned_long *puVar1;
  data_ptr_t pdVar2;
  const_reference pvVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  uchar **rhs_locations;
  idx_t entry_idx;
  bool bVar7;
  value_type rhs_offset_in_row;
  SelectionVector *lhs_sel;
  idx_t local_68;
  double local_58;
  uint local_4c;
  data_ptr_t local_48;
  value_type local_40;
  SelectionVector *local_38;
  
  puVar1 = (lhs_format->unified).validity.super_TemplatedValidityMask<unsigned_long>.validity_mask;
  local_38 = (lhs_format->unified).sel;
  local_48 = (lhs_format->unified).data;
  pdVar2 = rhs_row_locations->data;
  pvVar3 = vector<unsigned_long,_true>::operator[](&rhs_layout->offsets,col_idx);
  local_40 = *pvVar3;
  if (puVar1 == (unsigned_long *)0x0) {
    if (count != 0) {
      local_68 = 0;
      uVar5 = 0;
      do {
        uVar6 = uVar5;
        if (sel->sel_vector != (sel_t *)0x0) {
          uVar6 = (ulong)sel->sel_vector[uVar5];
        }
        uVar4 = uVar6;
        if (local_38->sel_vector != (sel_t *)0x0) {
          uVar4 = (ulong)local_38->sel_vector[uVar6];
        }
        local_58 = *(double *)(*(long *)(pdVar2 + uVar6 * 8) + local_40);
        if (((1 << ((byte)col_idx & 7) &
             (uint)*(byte *)(*(long *)(pdVar2 + uVar6 * 8) + (col_idx >> 3))) != 0) &&
           (bVar7 = GreaterThan::Operation<double>(&local_58,(double *)(local_48 + uVar4 * 8)),
           bVar7)) {
          sel->sel_vector[local_68] = (sel_t)uVar6;
          local_68 = local_68 + 1;
        }
        uVar5 = uVar5 + 1;
      } while (count != uVar5);
      return local_68;
    }
  }
  else if (count != 0) {
    local_4c = 1 << ((byte)col_idx & 7);
    local_68 = 0;
    uVar5 = 0;
    do {
      uVar6 = uVar5;
      if (sel->sel_vector != (sel_t *)0x0) {
        uVar6 = (ulong)sel->sel_vector[uVar5];
      }
      uVar4 = uVar6;
      if (local_38->sel_vector != (sel_t *)0x0) {
        uVar4 = (ulong)local_38->sel_vector[uVar6];
      }
      puVar1 = (lhs_format->unified).validity.super_TemplatedValidityMask<unsigned_long>.
               validity_mask;
      if (puVar1 == (unsigned_long *)0x0) {
        bVar7 = false;
      }
      else {
        bVar7 = (puVar1[uVar4 >> 6] >> (uVar4 & 0x3f) & 1) == 0;
      }
      local_58 = *(double *)(*(long *)(pdVar2 + uVar6 * 8) + local_40);
      if (((!bVar7) && ((*(byte *)(*(long *)(pdVar2 + uVar6 * 8) + (col_idx >> 3)) & local_4c) != 0)
          ) && (bVar7 = GreaterThan::Operation<double>(&local_58,(double *)(local_48 + uVar4 * 8)),
               bVar7)) {
        sel->sel_vector[local_68] = (sel_t)uVar6;
        local_68 = local_68 + 1;
      }
      uVar5 = uVar5 + 1;
    } while (count != uVar5);
    return local_68;
  }
  return 0;
}

Assistant:

static idx_t TemplatedMatch(Vector &, const TupleDataVectorFormat &lhs_format, SelectionVector &sel, const idx_t count,
                            const TupleDataLayout &rhs_layout, Vector &rhs_row_locations, const idx_t col_idx,
                            const vector<MatchFunction> &, SelectionVector *no_match_sel, idx_t &no_match_count) {
	if (lhs_format.unified.validity.AllValid()) {
		return TemplatedMatchLoop<NO_MATCH_SEL, T, OP, true>(lhs_format, sel, count, rhs_layout, rhs_row_locations,
		                                                     col_idx, no_match_sel, no_match_count);
	} else {
		return TemplatedMatchLoop<NO_MATCH_SEL, T, OP, false>(lhs_format, sel, count, rhs_layout, rhs_row_locations,
		                                                      col_idx, no_match_sel, no_match_count);
	}
}